

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

int readsettings(char *name)

{
  int __fd;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t __nbytes;
  uint uVar5;
  char fname [41];
  char buf [142];
  
  memset(buf,0,0x8e);
  if (canfd_mode == 1) {
    builtin_strncpy(fname + 8,"_fd.",5);
    __nbytes = 0x8d;
  }
  else {
    if (canfd_mode != 0) {
      puts("readsettings failed due to unspecified CAN FD mode");
      return -1;
    }
    fname[8] = '.';
    fname[9] = '\0';
    __nbytes = 0x1d;
  }
  builtin_strncpy(fname,"sniffset",8);
  sVar1 = strlen(fname);
  strncat(fname,name,0x28 - sVar1);
  __fd = open(fname,0);
  if (__fd < 1) {
    return -1;
  }
  idx = 0;
  do {
    sVar1 = read(__fd,buf,__nbytes);
    if (sVar1 != __nbytes) break;
    uVar2 = strtoul(buf + 1,(char **)0x0,0x10);
    lVar4 = (long)idx;
    sniftab[lVar4].current.can_id = (canid_t)uVar2;
    sniftab[lVar4].flags = sniftab[lVar4].flags & 0xfffffffeU | (byte)buf[10] & 1;
    uVar2 = 7;
    if (max_dlen != '\0') {
      uVar2 = 0x3f;
    }
    uVar5 = (int)uVar2 * 2 + 0xc;
    for (; -1 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
      uVar3 = strtoul(buf + uVar5,(char **)0x0,0x10);
      lVar4 = (long)idx;
      *(char *)(uVar2 + lVar4 * 0x158 + 0x106298) = (char)uVar3;
      buf[uVar5] = '\0';
      uVar5 = uVar5 - 2;
    }
    idx = (int)lVar4 + 1;
  } while ((int)lVar4 < 0x7ff);
  close(__fd);
  return idx;
}

Assistant:

int readsettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	char buf[142] = {0};
	int entrylen;
	int j;
	bool done = false;

	if (canfd_mode == CANFD_OFF) {
		entrylen = 29;
		strcpy(fname, SETFNAME);
	} else if (canfd_mode == CANFD_ON) {
		entrylen = 141;
		strcpy(fname, SETFDFNAME);
	} else {
		printf("readsettings failed due to unspecified CAN FD mode\n");
		return -1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_RDONLY);

	if (fd <= 0) {
		return -1;
	}
	idx = 0;
	while (!done) {
		if (read(fd, &buf, entrylen) != entrylen) {
			done = true;
			continue;
		}
		unsigned long id = strtoul(&buf[1], NULL, 16);

		sniftab[idx].current.can_id = id;

		if (buf[10] & 1)
			do_set(idx, ENABLE);
		else
			do_clr(idx, ENABLE);

		for (j = max_dlen - 1; j >= 0 ; j--) {
			sniftab[idx].notch.data[j] =
				(__u8) strtoul(&buf[2*j+12], NULL, 16) & 0xFF;
			buf[2*j+12] = 0; /* cut off each time */
		}

		if (++idx >= MAX_SLOTS)
			break;

	}
	close(fd);
	return idx;
}